

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_conserved_exp_entropy_ark.c
# Opt level: O2

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double *pdVar1;
  undefined8 *puVar2;
  double dVar3;
  
  pdVar1 = (double *)N_VGetArrayPointer();
  puVar2 = (undefined8 *)SUNDenseMatrix_Data(J);
  *puVar2 = 0;
  dVar3 = exp(*pdVar1);
  puVar2[1] = dVar3;
  dVar3 = exp(pdVar1[1]);
  puVar2[2] = -dVar3;
  puVar2[3] = 0;
  return 0;
}

Assistant:

int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J, void* user_data,
        N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* ydata = N_VGetArrayPointer(y);
  sunrealtype* Jdata = SUNDenseMatrix_Data(J);

  /* column 0 */
  Jdata[0] = SUN_RCONST(0.0);
  Jdata[1] = EXP(ydata[0]);

  /* column 1 */
  Jdata[2] = -EXP(ydata[1]);
  Jdata[3] = SUN_RCONST(0.0);

  return 0;
}